

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::SchemaElement::read(SchemaElement *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  undefined8 *puVar7;
  ushort *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int32_t ecast54;
  int16_t fid;
  TType ftype;
  string fname;
  type local_98;
  ushort local_92;
  uint local_90;
  int local_8c;
  int32_t *local_88;
  string *local_80;
  int32_t *local_78;
  int32_t *local_70;
  int32_t *local_68;
  int32_t *local_60;
  LogicalType *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->logicalType;
  local_60 = &this->field_id;
  local_68 = &this->precision;
  local_70 = &this->scale;
  local_78 = &this->num_children;
  local_80 = &this->name;
  local_88 = &this->type_length;
  local_90 = 0;
  do {
    __nbytes_00 = &local_92;
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_8c);
    if (local_8c == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if ((local_90 & 1) == 0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar7[1] = puVar7 + 3;
        puVar7[2] = 0;
        *(undefined1 *)(puVar7 + 3) = 0;
        *puVar7 = &PTR__TException_024c6200;
        *(undefined4 *)(puVar7 + 5) = 1;
        __cxa_throw(puVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar3 + iVar2);
    }
    switch(local_92) {
    case 1:
      if (local_8c != 8) break;
      iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_98);
      this->type = local_98;
      *(byte *)&this->__isset = *(byte *)&this->__isset | 1;
      goto LAB_01cd7cf0;
    case 2:
      if (local_8c == 8) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_88);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 2;
        goto LAB_01cd7cf0;
      }
      break;
    case 3:
      if (local_8c == 8) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_98);
        this->repetition_type = local_98;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 4;
        goto LAB_01cd7cf0;
      }
      break;
    case 4:
      if (local_8c == 0xb) {
        iVar4 = (*this_00->_vptr_TProtocol[0x2a])(this_00,local_80);
        local_90 = (uint)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
        goto LAB_01cd7cf0;
      }
      break;
    case 5:
      if (local_8c == 8) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_78);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 8;
        goto LAB_01cd7cf0;
      }
      break;
    case 6:
      if (local_8c == 8) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_98);
        this->converted_type = local_98;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x10;
        goto LAB_01cd7cf0;
      }
      break;
    case 7:
      if (local_8c == 8) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_70);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x20;
        goto LAB_01cd7cf0;
      }
      break;
    case 8:
      if (local_8c == 8) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_68);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x40;
        goto LAB_01cd7cf0;
      }
      break;
    case 9:
      if (local_8c == 8) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_60);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x80;
        goto LAB_01cd7cf0;
      }
      break;
    case 10:
      if (local_8c == 0xc) {
        sVar6 = LogicalType::read(local_58,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        puVar1 = &(this->__isset).field_0x1;
        *puVar1 = *puVar1 | 1;
        goto LAB_01cd7cf0;
      }
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_01cd7cf0:
    iVar5 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar4 + iVar3 + iVar2 + iVar5;
  } while( true );
}

Assistant:

uint32_t SchemaElement::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_name = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast54;
          xfer += iprot->readI32(ecast54);
          this->type = static_cast<Type::type>(ecast54);
          this->__isset.type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->type_length);
          this->__isset.type_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast55;
          xfer += iprot->readI32(ecast55);
          this->repetition_type = static_cast<FieldRepetitionType::type>(ecast55);
          this->__isset.repetition_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->name);
          isset_name = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_children);
          this->__isset.num_children = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast56;
          xfer += iprot->readI32(ecast56);
          this->converted_type = static_cast<ConvertedType::type>(ecast56);
          this->__isset.converted_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->scale);
          this->__isset.scale = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->precision);
          this->__isset.precision = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->field_id);
          this->__isset.field_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->logicalType.read(iprot);
          this->__isset.logicalType = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_name)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}